

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O3

void Llb_NonlinCutNodes_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  void **ppvVar4;
  uint uVar5;
  
  iVar1 = p->nTravIds;
  iVar2 = pObj->TravId;
  while( true ) {
    if (iVar2 == iVar1) {
      return;
    }
    pObj->TravId = iVar1;
    uVar3 = (uint)*(undefined8 *)&pObj->field_0x18;
    uVar5 = uVar3 & 7;
    if (uVar5 != 3) break;
    if ((pObj->field_0).CioId < p->nTruePos) {
      if (((ulong)pObj & 1) != 0) goto LAB_00907d63;
      goto LAB_00907cae;
    }
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
    iVar2 = pObj->TravId;
  }
  if (((ulong)pObj & 1) != 0) {
LAB_00907d63:
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aig.h"
                  ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
  }
  if (uVar5 == 1) {
    return;
  }
LAB_00907cae:
  if (0xfffffffd < (uVar3 & 7) - 7) {
    Llb_NonlinCutNodes_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vNodes);
    Llb_NonlinCutNodes_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),vNodes);
    uVar3 = vNodes->nSize;
    if (uVar3 == vNodes->nCap) {
      if ((int)uVar3 < 0x10) {
        if (vNodes->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc(0x80);
        }
        else {
          ppvVar4 = (void **)realloc(vNodes->pArray,0x80);
        }
        vNodes->pArray = ppvVar4;
        vNodes->nCap = 0x10;
      }
      else {
        if (vNodes->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc((ulong)uVar3 << 4);
        }
        else {
          ppvVar4 = (void **)realloc(vNodes->pArray,(ulong)uVar3 << 4);
        }
        vNodes->pArray = ppvVar4;
        vNodes->nCap = uVar3 * 2;
      }
    }
    else {
      ppvVar4 = vNodes->pArray;
    }
    iVar1 = vNodes->nSize;
    vNodes->nSize = iVar1 + 1;
    ppvVar4[iVar1] = pObj;
    return;
  }
  __assert_fail("Aig_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/llb/llb3Image.c"
                ,0x1f2,"void Llb_NonlinCutNodes_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

void Llb_NonlinCutNodes_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Saig_ObjIsLi(p, pObj) )
    {
        Llb_NonlinCutNodes_rec(p, Aig_ObjFanin0(pObj), vNodes);
        return;
    }
    if ( Aig_ObjIsConst1(pObj) )
        return;
    assert( Aig_ObjIsNode(pObj) );
    Llb_NonlinCutNodes_rec(p, Aig_ObjFanin0(pObj), vNodes);
    Llb_NonlinCutNodes_rec(p, Aig_ObjFanin1(pObj), vNodes);
    Vec_PtrPush( vNodes, pObj );
}